

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QDockWidgetGroupLayout::~QDockWidgetGroupLayout(QDockWidgetGroupLayout *this)

{
  *(undefined ***)&this->super_QLayout = &PTR_metaObject_007cf580;
  (this->super_QLayout).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QDockWidgetGroupLayout_007cf688;
  QDockAreaLayoutInfo::deleteAllLayoutItems(&this->layoutState);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&this->savedState);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&this->layoutState);
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::~QMainWindowLayoutSeparatorHelper
            (&this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>);
  QLayout::~QLayout(&this->super_QLayout);
  return;
}

Assistant:

~QDockWidgetGroupLayout() {
        layoutState.deleteAllLayoutItems();
    }